

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_file_stat
                  (mz_zip_archive *pZip,mz_uint file_index,mz_zip_archive_file_stat *pStat)

{
  time_t tVar1;
  uint local_50;
  uint local_4c;
  mz_uint8 *p;
  mz_uint n;
  mz_zip_archive_file_stat *pStat_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  long local_10;
  
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    local_10 = 0;
  }
  else {
    local_10 = (long)(pZip->m_pState->m_central_dir).m_p +
               (ulong)*(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p +
                               (ulong)file_index * 4);
  }
  if ((local_10 == 0) || (pStat == (mz_zip_archive_file_stat *)0x0)) {
    pZip_local._0_4_ = 0;
  }
  else {
    pStat->m_file_index = file_index;
    pStat->m_central_dir_ofs =
         *(mz_uint32 *)((long)(pZip->m_pState->m_central_dir_offsets).m_p + (ulong)file_index * 4);
    pStat->m_version_made_by = *(mz_uint16 *)(local_10 + 4);
    pStat->m_version_needed = *(mz_uint16 *)(local_10 + 6);
    pStat->m_bit_flag = *(mz_uint16 *)(local_10 + 8);
    pStat->m_method = *(mz_uint16 *)(local_10 + 10);
    tVar1 = (anonymous_namespace)::miniz::mz_zip_dos_to_time_t
                      ((uint)*(ushort *)(local_10 + 0xc),(uint)*(ushort *)(local_10 + 0xe));
    pStat->m_time = tVar1;
    pStat->m_crc32 = *(mz_uint32 *)(local_10 + 0x10);
    pStat->m_comp_size = (ulong)*(uint *)(local_10 + 0x14);
    pStat->m_uncomp_size = (ulong)*(uint *)(local_10 + 0x18);
    pStat->m_internal_attr = *(mz_uint16 *)(local_10 + 0x24);
    pStat->m_external_attr = *(mz_uint32 *)(local_10 + 0x26);
    pStat->m_local_header_ofs = (ulong)*(uint *)(local_10 + 0x2a);
    local_4c = (uint)*(ushort *)(local_10 + 0x1c);
    if (0x102 < local_4c) {
      local_4c = 0x103;
    }
    memcpy(pStat->m_filename,(void *)(local_10 + 0x2e),(ulong)local_4c);
    pStat->m_filename[local_4c] = '\0';
    local_50 = (uint)*(ushort *)(local_10 + 0x20);
    if (0xfe < local_50) {
      local_50 = 0xff;
    }
    pStat->m_comment_size = local_50;
    memcpy(pStat->m_comment,
           (void *)(local_10 + 0x2e + (ulong)*(ushort *)(local_10 + 0x1c) +
                   (ulong)*(ushort *)(local_10 + 0x1e)),(ulong)local_50);
    pStat->m_comment[local_50] = '\0';
    pZip_local._0_4_ = 1;
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_reader_file_stat(mz_zip_archive *pZip, mz_uint file_index,
                                mz_zip_archive_file_stat *pStat) {
  mz_uint n;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if ((!p) || (!pStat))
    return MZ_FALSE;

  // Unpack the central directory record.
  pStat->m_file_index = file_index;
  pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(
      &pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
  pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
  pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
  pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
  pStat->m_time =
      mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS),
                           MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
  pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
  pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
  pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
  pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
  pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
  pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

  // Copy as much of the filename and comment as possible.
  n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
  memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
  pStat->m_filename[n] = '\0';

  n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
  pStat->m_comment_size = n;
  memcpy(pStat->m_comment, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS),
         n);
  pStat->m_comment[n] = '\0';

  return MZ_TRUE;
}